

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

int __thiscall
Catch::Matchers::Impl::
MatcherImpl<Catch::Matchers::Impl::StdString::Contains,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::clone(MatcherImpl<Catch::Matchers::Impl::StdString::Contains,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Contains *this_00;
  
  this_00 = (Contains *)operator_new(0x30);
  StdString::Contains::Contains(this_00,(Contains *)__fn);
  (this->
  super_Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)this_00;
  (**(code **)(*(long *)&(this_00->
                         super_MatcherImpl<Catch::Matchers::Impl::StdString::Contains,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ).
                         super_Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              + 0x10))(this_00);
  return (int)this;
}

Assistant:

virtual Ptr<Matcher<ExpressionT> > clone() const {
            return Ptr<Matcher<ExpressionT> >( new DerivedT( static_cast<DerivedT const&>( *this ) ) );
        }